

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

void __thiscall
testing::internal::ElementsAreMatcherImpl<const_pstore::small_vector<int,_4UL>_&>::DescribeTo
          (ElementsAreMatcherImpl<const_pstore::small_vector<int,_4UL>_&> *this,ostream *os)

{
  MatcherDescriberInterface in_RAX;
  long lVar1;
  ostream *poVar2;
  pointer *__ptr;
  ulong uVar3;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  lVar1 = ((long)(this->matchers_).
                 super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->matchers_).
                super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  if (lVar1 == 1) {
    std::operator<<(os,"has 1 element that ");
    MatcherBase<const_int_&>::DescribeTo
              (&((this->matchers_).
                 super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->super_MatcherBase<const_int_&>,os);
    return;
  }
  if (lVar1 == 0) {
    std::operator<<(os,"is empty");
    return;
  }
  local_38._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_RAX._vptr_MatcherDescriberInterface;
  poVar2 = std::operator<<(os,"has ");
  Elements((ElementsAreMatcherImpl<const_pstore::small_vector<int,_4UL>_&> *)&local_38,
           ((long)(this->matchers_).
                  super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->matchers_).
                 super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  poVar2 = testing::operator<<(poVar2,(Message *)&local_38);
  std::operator<<(poVar2," where\n");
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_38._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(_func_int **)
                  local_38._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl + 8))();
  }
  lVar1 = 0;
  uVar3 = 0;
  while (uVar3 != ((long)(this->matchers_).
                         super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->matchers_).
                        super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x18) {
    poVar2 = std::operator<<(os,"element #");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2," ");
    MatcherBase<const_int_&>::DescribeTo
              ((MatcherBase<const_int_&> *)
               ((long)&(((this->matchers_).
                         super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->super_MatcherBase<const_int_&>)
                       .super_MatcherDescriberInterface._vptr_MatcherDescriberInterface + lVar1),os)
    ;
    uVar3 = uVar3 + 1;
    if (uVar3 < (ulong)(((long)(this->matchers_).
                               super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->matchers_).
                              super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x18)) {
      std::operator<<(os,",\n");
    }
    lVar1 = lVar1 + 0x18;
  }
  return;
}

Assistant:

void DescribeTo(::std::ostream* os) const override {
    if (count() == 0) {
      *os << "is empty";
    } else if (count() == 1) {
      *os << "has 1 element that ";
      matchers_[0].DescribeTo(os);
    } else {
      *os << "has " << Elements(count()) << " where\n";
      for (size_t i = 0; i != count(); ++i) {
        *os << "element #" << i << " ";
        matchers_[i].DescribeTo(os);
        if (i + 1 < count()) {
          *os << ",\n";
        }
      }
    }
  }